

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O1

UtcDate * FIX::UtcDateConvertor::convert(UtcDate *__return_storage_ptr__,string *value)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  FieldConvertError *this;
  long lVar5;
  int iVar6;
  int iVar7;
  
  if (value->_M_string_length == 8) {
    lVar5 = 0;
    do {
      if (9 < (int)(value->_M_dataplus)._M_p[lVar5] - 0x30U) {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
        goto LAB_001e06f5;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    pcVar2 = (value->_M_dataplus)._M_p;
    if (((int)pcVar2[5] + pcVar2[4] * 10) - 0x21dU < 0xfffffff4) {
      this = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(this,value);
    }
    else {
      if (0xffffffe0 < ((int)pcVar2[7] + pcVar2[6] * 10) - 0x230U) {
        iVar7 = (int)pcVar2[5] + pcVar2[4] * 10 + -0x1e0;
        iVar3 = (0x3e - iVar7) / 0xc;
        iVar6 = ((int)pcVar2[3] + ((int)pcVar2[2] + ((int)pcVar2[1] + *pcVar2 * 10) * 10) * 10) -
                iVar3;
        iVar1 = iVar6 + -0xbd90;
        iVar6 = iVar6 + -0xbd8d;
        if (-1 < iVar1) {
          iVar6 = iVar1;
        }
        iVar4 = (int)((ulong)((long)iVar1 * -0x51eb851f) >> 0x20);
        (__return_storage_ptr__->super_DateTime).m_date =
             (int)pcVar2[7] + pcVar2[6] * 10 +
             iVar1 / 400 + ((iVar4 >> 5) - (iVar4 >> 0x1f)) + (iVar6 >> 2) + iVar1 * 0x16d +
             ((iVar7 + iVar3 * 0xc) * 0x99 + -0x1e79) / 5 + -0x7f3d;
        (__return_storage_ptr__->super_DateTime).m_time = 0;
        (__return_storage_ptr__->super_DateTime)._vptr_DateTime =
             (_func_int **)&PTR__DateTime_00329160;
        return __return_storage_ptr__;
      }
      this = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(this,value);
    }
  }
  else {
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,value);
  }
LAB_001e06f5:
  __cxa_throw(this,&FieldConvertError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(FieldConvertError) {
    if (value.size() != 8) {
      throw FieldConvertError(value);
    }

    int i = 0;
    for (int c = 0; c < 8; ++c) {
      if (!IS_DIGIT(value[i++])) {
        throw FieldConvertError(value);
      }
    }

    int year, mon, mday;

    i = 0;

    year = value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';

    mon = value[i++] - '0';
    mon = 10 * mon + value[i++] - '0';
    if (mon < 1 || 12 < mon) {
      throw FieldConvertError(value);
    }

    mday = value[i++] - '0';
    mday = 10 * mday + value[i++] - '0';
    if (mday < 1 || 31 < mday) {
      throw FieldConvertError(value);
    }

    return UtcDateOnly(mday, mon, year);
  }